

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall libcellml::Annotator::AnnotatorImpl::doSetImportSourceIds(AnnotatorImpl *this)

{
  pointer *__r;
  bool bVar1;
  byte bVar2;
  __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_108 [64];
  undefined1 local_c8 [8];
  AnyCellmlElementPtr entry;
  string id;
  shared_ptr<libcellml::ImportSource> *importSource;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  *__range1;
  shared_ptr<const_libcellml::Model> local_48;
  undefined1 local_38 [8];
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  importSources;
  shared_ptr<libcellml::Model> model;
  AnnotatorImpl *this_local;
  
  __r = &importSources.
         super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::weak_ptr<libcellml::Model>::lock((weak_ptr<libcellml::Model> *)__r);
  std::shared_ptr<libcellml::Model_const>::shared_ptr<libcellml::Model,void>
            ((shared_ptr<libcellml::Model_const> *)&local_48,(shared_ptr<libcellml::Model> *)__r);
  getAllImportSources((vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                       *)local_38,(ModelConstPtr *)&local_48);
  std::shared_ptr<const_libcellml::Model>::~shared_ptr(&local_48);
  __end1 = std::
           vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
           ::begin((vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                    *)local_38);
  importSource = (shared_ptr<libcellml::ImportSource> *)
                 std::
                 vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                 ::end((vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                        *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
                                     *)&importSource), bVar1) {
    this_00 = (__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
                 ::operator*(&__end1);
    peVar3 = std::
             __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    Entity::id_abi_cxx11_((string *)((long)&id.field_2 + 8),&peVar3->super_Entity);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
    if ((bVar2 & 1) != 0) {
      makeUniqueId_abi_cxx11_
                ((string *)
                 &entry.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this);
      peVar3 = std::
               __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      Entity::setId(&peVar3->super_Entity,
                    (string *)
                    &entry.
                     super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      AnyCellmlElement::AnyCellmlElementImpl::create();
      peVar4 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c8);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                (peVar4->mPimpl,(ImportSourcePtr *)this_00);
      convertToWeak((AnnotatorImpl *)local_108,(AnyCellmlElementPtr *)this);
      std::make_pair<std::__cxx11::string&,std::shared_ptr<libcellml::AnyCellmlElement>>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
                  *)(local_108 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &entry.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(shared_ptr<libcellml::AnyCellmlElement> *)local_108);
      std::
      multimap<std::__cxx11::string,std::shared_ptr<libcellml::AnyCellmlElement>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
      ::insert<std::pair<std::__cxx11::string,std::shared_ptr<libcellml::AnyCellmlElement>>>
                ((multimap<std::__cxx11::string,std::shared_ptr<libcellml::AnyCellmlElement>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::AnyCellmlElement>>>>
                  *)&this->mIdList,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
                  *)(local_108 + 0x10));
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>
               *)(local_108 + 0x10));
      std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
                ((shared_ptr<libcellml::AnyCellmlElement> *)local_108);
      std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr
                ((shared_ptr<libcellml::AnyCellmlElement> *)local_c8);
      std::__cxx11::string::~string
                ((string *)
                 &entry.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ::~vector((vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
             *)local_38);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importSources.
              super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Annotator::AnnotatorImpl::doSetImportSourceIds()
{
    // Import items.
    auto model = mModel.lock();
    auto importSources = getAllImportSources(model);
    for (auto &importSource : importSources) {
        if (importSource->id().empty()) {
            auto id = makeUniqueId();
            importSource->setId(id);
            auto entry = AnyCellmlElement::AnyCellmlElementImpl::create();
            entry->mPimpl->setImportSource(importSource);
            mIdList.insert(std::make_pair(id, convertToWeak(entry)));
        }
    }
}